

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

Literals * wasm::getLiteralsFromConstExpression(Literals *__return_storage_ptr__,Expression *curr)

{
  size_t *__return_storage_ptr___00;
  ArenaVector<wasm::Expression_*> *pAVar1;
  Expression **ppEVar2;
  initializer_list<wasm::Literal> init;
  undefined1 local_58 [8];
  Iterator __begin2;
  
  if (curr->_id == TupleMakeId) {
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.
    super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 =
         0;
    __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar1 = (ArenaVector<wasm::Expression_*> *)curr[1].type.id;
    __return_storage_ptr___00 = &__begin2.index;
    local_58 = (undefined1  [8])(curr + 1);
    while ((__begin2.parent != pAVar1 || (local_58 != (undefined1  [8])(curr + 1)))) {
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_58);
      getLiteralFromConstExpression((Literal *)__return_storage_ptr___00,*ppEVar2);
      SmallVector<wasm::Literal,_1UL>::push_back
                (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,
                 (Literal *)__return_storage_ptr___00);
      Literal::~Literal((Literal *)__return_storage_ptr___00);
      __begin2.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin2.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
  }
  else {
    getLiteralFromConstExpression((Literal *)&__begin2.index,curr);
    init._M_len = 1;
    init._M_array = (iterator)&__begin2.index;
    Literals::Literals(__return_storage_ptr__,init);
    Literal::~Literal((Literal *)&__begin2.index);
  }
  return __return_storage_ptr__;
}

Assistant:

Literals getLiteralsFromConstExpression(Expression* curr) {
  // TODO: Do we need this function given that Properties::getLiterals
  // (currently) does the same?
  if (auto* t = curr->dynCast<TupleMake>()) {
    Literals values;
    for (auto* operand : t->operands) {
      values.push_back(getLiteralFromConstExpression(operand));
    }
    return values;
  } else {
    return {getLiteralFromConstExpression(curr)};
  }
}